

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall amrex::EB2::Level::buildCellFlag(Level *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  int iVar35;
  Periodicity PVar36;
  Box local_1ac;
  Array4<amrex::EBCellFlag> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  for (lVar19 = 0xd48; lVar19 != 0x11c8; lVar19 = lVar19 + 0x180) {
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          0x100000001;
    mfi.fabArray._0_4_ = 1;
    PVar36 = Geometry::periodicity(&this->m_geom);
    local_190.p = PVar36.period.vect._0_8_;
    local_190.jstride._0_4_ = PVar36.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               ((long)(this->m_geom).super_CoordSys.offset + lVar19 + -8),0,1,(IntVect *)&mfi,
               (Periodicity *)&local_190,false);
  }
  MFIter::MFIter(&mfi,&(this->m_cellflag).super_FabArrayBase,true);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_1ac,&mfi);
    FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
              (&local_190,&this->m_cellflag,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_d0,(FabArray<amrex::FArrayBox> *)&this->m_areafrac,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&(this->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_150,&(this->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,&mfi);
    iVar10 = local_1ac.smallend.vect[2];
    while (iVar8 = iVar10, iVar8 <= local_1ac.bigend.vect[2]) {
      iVar10 = iVar8 + 1;
      iVar11 = local_1ac.smallend.vect[1];
      while (iVar9 = iVar11, iVar9 <= local_1ac.bigend.vect[1]) {
        iVar11 = iVar9 + 1;
        for (iVar35 = local_1ac.smallend.vect[0]; iVar35 <= local_1ac.bigend.vect[0];
            iVar35 = iVar35 + 1) {
          lVar19 = ((long)iVar9 - (long)local_190.begin.y) *
                   CONCAT44(local_190.jstride._4_4_,(int)local_190.jstride);
          lVar34 = ((long)iVar8 - (long)local_190.begin.z) * local_190.kstride;
          uVar32 = local_190.p[lVar19 + ((long)iVar35 - (long)local_190.begin.x) + lVar34].flag &
                   0x1f;
          if ((~local_190.p[lVar19 + ((long)iVar35 - (long)local_190.begin.x) + lVar34].flag & 3) !=
              0) {
            lVar24 = (long)(iVar35 - local_d0.begin.x);
            lVar16 = (iVar9 - local_d0.begin.y) * local_d0.jstride;
            lVar26 = (iVar8 - local_d0.begin.z) * local_d0.kstride;
            dVar2 = local_d0.p[lVar16 + lVar24 + lVar26];
            iVar1 = iVar35 + 1;
            lVar12 = (long)(iVar1 - local_d0.begin.x);
            dVar3 = local_d0.p[lVar16 + lVar12 + lVar26];
            lVar25 = (long)(iVar35 - local_110.begin.x);
            lVar27 = (iVar9 - local_110.begin.y) * local_110.jstride;
            lVar22 = (iVar8 - local_110.begin.z) * local_110.kstride;
            dVar4 = local_110.p[lVar27 + lVar25 + lVar22];
            lVar13 = (iVar11 - local_110.begin.y) * local_110.jstride;
            dVar5 = local_110.p[lVar13 + lVar25 + lVar22];
            lVar17 = (long)(iVar35 - local_150.begin.x);
            lVar28 = (iVar9 - local_150.begin.y) * local_150.jstride;
            lVar20 = (iVar8 - local_150.begin.z) * local_150.kstride;
            dVar6 = local_150.p[lVar28 + lVar17 + lVar20];
            lVar29 = (iVar10 - local_150.begin.z) * local_150.kstride;
            dVar7 = local_150.p[lVar28 + lVar17 + lVar29];
            uVar32 = (-(uint)(dVar7 != 0.0) & 1) << 0x1b |
                     (-(uint)(dVar6 != 0.0) & 1) << 9 |
                     (-(uint)(dVar5 != 0.0) & 1) << 0x15 |
                     (-(uint)(dVar4 != 0.0) & 1) << 0xf |
                     (-(uint)(dVar3 != 0.0) & 1) << 0x13 |
                     (-(uint)(dVar2 != 0.0) & 1) << 0x11 | uVar32 | 0x40000;
            uVar14 = ~local_d0.begin.y;
            uVar31 = ~local_150.begin.x;
            uVar15 = ~local_150.begin.y;
            uVar33 = ~local_110.begin.x;
            if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                ((local_110.p[lVar27 + (int)(iVar35 + uVar33) + lVar22] != 0.0 ||
                 (NAN(local_110.p[lVar27 + (int)(iVar35 + uVar33) + lVar22]))))) ||
               (((dVar4 != 0.0 || (NAN(dVar4))) &&
                ((local_d0.p[(int)(iVar9 + uVar14) * local_d0.jstride + lVar24 + lVar26] != 0.0 ||
                 (NAN(local_d0.p[(int)(iVar9 + uVar14) * local_d0.jstride + lVar24 + lVar26])))))))
            {
              lVar30 = (int)(iVar9 + uVar15) * local_150.jstride;
              uVar18 = (-(uint)(local_150.p[lVar30 + (int)(iVar35 + uVar31) + lVar20] != 0.0) & 1)
                       << 5 | uVar32;
              uVar32 = uVar18 | 0x4000;
              if ((local_150.p[lVar30 + (int)(iVar35 + uVar31) + lVar29] != 0.0) ||
                 (NAN(local_150.p[lVar30 + (int)(iVar35 + uVar31) + lVar29]))) {
                uVar32 = uVar18 | 0x804000;
              }
            }
            if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                ((local_110.p[lVar27 + (iVar1 - local_110.begin.x) + lVar22] != 0.0 ||
                 (NAN(local_110.p[lVar27 + (iVar1 - local_110.begin.x) + lVar22]))))) ||
               (((dVar4 != 0.0 || (NAN(dVar4))) &&
                ((local_d0.p[(int)(iVar9 + uVar14) * local_d0.jstride + lVar12 + lVar26] != 0.0 ||
                 (NAN(local_d0.p[(int)(iVar9 + uVar14) * local_d0.jstride + lVar12 + lVar26])))))))
            {
              lVar30 = (int)(iVar9 + uVar15) * local_150.jstride;
              uVar18 = (-(uint)(local_150.p[lVar30 + (iVar1 - local_150.begin.x) + lVar20] != 0.0) &
                       1) << 7 | uVar32;
              uVar32 = uVar18 | 0x10000;
              if ((local_150.p[lVar30 + (iVar1 - local_150.begin.x) + lVar29] != 0.0) ||
                 (NAN(local_150.p[lVar30 + (iVar1 - local_150.begin.x) + lVar29]))) {
                uVar32 = uVar18 | 0x2010000;
              }
            }
            if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                ((local_110.p[lVar13 + (int)(iVar35 + uVar33) + lVar22] != 0.0 ||
                 (NAN(local_110.p[lVar13 + (int)(iVar35 + uVar33) + lVar22]))))) ||
               (((dVar5 != 0.0 || (NAN(dVar5))) &&
                ((local_d0.p[(iVar11 - local_d0.begin.y) * local_d0.jstride + lVar24 + lVar26] !=
                  0.0 || (NAN(local_d0.p
                              [(iVar11 - local_d0.begin.y) * local_d0.jstride + lVar24 + lVar26]))))
                ))) {
              lVar30 = (iVar11 - local_150.begin.y) * local_150.jstride;
              uVar18 = (-(uint)(local_150.p[lVar30 + (int)(iVar35 + uVar31) + lVar20] != 0.0) & 1)
                       << 0xb | uVar32;
              uVar32 = uVar18 | 0x100000;
              if ((local_150.p[lVar30 + (int)(iVar35 + uVar31) + lVar29] != 0.0) ||
                 (NAN(local_150.p[lVar30 + (int)(iVar35 + uVar31) + lVar29]))) {
                uVar32 = uVar18 | 0x20100000;
              }
            }
            if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                ((local_110.p[lVar13 + (iVar1 - local_110.begin.x) + lVar22] != 0.0 ||
                 (NAN(local_110.p[lVar13 + (iVar1 - local_110.begin.x) + lVar22]))))) ||
               (((dVar5 != 0.0 || (NAN(dVar5))) &&
                ((local_d0.p[(iVar11 - local_d0.begin.y) * local_d0.jstride + lVar12 + lVar26] !=
                  0.0 || (NAN(local_d0.p
                              [(iVar11 - local_d0.begin.y) * local_d0.jstride + lVar12 + lVar26]))))
                ))) {
              lVar22 = (iVar11 - local_150.begin.y) * local_150.jstride;
              uVar18 = (-(uint)(local_150.p[lVar22 + (iVar1 - local_150.begin.x) + lVar20] != 0.0) &
                       1) << 0xd | uVar32;
              uVar32 = uVar18 | 0x400000;
              if ((local_150.p[lVar22 + (iVar1 - local_150.begin.x) + lVar29] != 0.0) ||
                 (NAN(local_150.p[lVar22 + (iVar1 - local_150.begin.x) + lVar29]))) {
                uVar32 = uVar18 | 0x80400000;
              }
            }
            uVar21 = ~local_d0.begin.z;
            uVar18 = ~local_110.begin.z;
            if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                ((local_150.p[lVar28 + (int)(iVar35 + uVar31) + lVar20] != 0.0 ||
                 (NAN(local_150.p[lVar28 + (int)(iVar35 + uVar31) + lVar20]))))) ||
               (((dVar6 != 0.0 || (NAN(dVar6))) &&
                ((local_d0.p[lVar16 + lVar24 + (int)(iVar8 + uVar21) * local_d0.kstride] != 0.0 ||
                 (NAN(local_d0.p[lVar16 + lVar24 + (int)(iVar8 + uVar21) * local_d0.kstride])))))))
            {
              lVar22 = (int)(iVar8 + uVar18) * local_110.kstride;
              uVar23 = (-(uint)(local_110.p[lVar27 + (int)(iVar35 + uVar33) + lVar22] != 0.0) & 1)
                       << 5 | uVar32;
              uVar32 = uVar23 | 0x100;
              if ((local_110.p[lVar13 + (int)(iVar35 + uVar33) + lVar22] != 0.0) ||
                 (NAN(local_110.p[lVar13 + (int)(iVar35 + uVar33) + lVar22]))) {
                uVar32 = uVar23 | 0x900;
              }
            }
            if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                ((local_150.p[lVar28 + (iVar1 - local_150.begin.x) + lVar20] != 0.0 ||
                 (NAN(local_150.p[lVar28 + (iVar1 - local_150.begin.x) + lVar20]))))) ||
               (((dVar6 != 0.0 || (NAN(dVar6))) &&
                ((local_d0.p[lVar16 + lVar12 + (int)(iVar8 + uVar21) * local_d0.kstride] != 0.0 ||
                 (NAN(local_d0.p[lVar16 + lVar12 + (int)(iVar8 + uVar21) * local_d0.kstride])))))))
            {
              lVar22 = (int)(iVar8 + uVar18) * local_110.kstride;
              uVar23 = (-(uint)(local_110.p[lVar27 + (iVar1 - local_110.begin.x) + lVar22] != 0.0) &
                       1) << 7 | uVar32;
              uVar32 = uVar23 | 0x400;
              if ((local_110.p[lVar13 + (iVar1 - local_110.begin.x) + lVar22] != 0.0) ||
                 (NAN(local_110.p[lVar13 + (iVar1 - local_110.begin.x) + lVar22]))) {
                uVar32 = uVar23 | 0x2400;
              }
            }
            if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                ((local_150.p[lVar28 + (int)(uVar31 + iVar35) + lVar29] != 0.0 ||
                 (NAN(local_150.p[lVar28 + (int)(uVar31 + iVar35) + lVar29]))))) ||
               (((dVar7 != 0.0 || (NAN(dVar7))) &&
                ((local_d0.p[lVar16 + lVar24 + (iVar10 - local_d0.begin.z) * local_d0.kstride] !=
                  0.0 || (NAN(local_d0.p
                              [lVar16 + lVar24 + (iVar10 - local_d0.begin.z) * local_d0.kstride]))))
                ))) {
              lVar22 = (iVar10 - local_110.begin.z) * local_110.kstride;
              uVar31 = (-(uint)(local_110.p[lVar27 + (int)(iVar35 + uVar33) + lVar22] != 0.0) & 1)
                       << 0x17 | uVar32;
              uVar32 = uVar31 | 0x4000000;
              if ((local_110.p[lVar13 + (int)(iVar35 + uVar33) + lVar22] != 0.0) ||
                 (NAN(local_110.p[lVar13 + (int)(iVar35 + uVar33) + lVar22]))) {
                uVar32 = uVar31 | 0x24000000;
              }
            }
            if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                ((local_150.p[lVar28 + (iVar1 - local_150.begin.x) + lVar29] != 0.0 ||
                 (NAN(local_150.p[lVar28 + (iVar1 - local_150.begin.x) + lVar29]))))) ||
               (((dVar7 != 0.0 || (NAN(dVar7))) &&
                ((local_d0.p[lVar16 + lVar12 + (iVar10 - local_d0.begin.z) * local_d0.kstride] !=
                  0.0 || (NAN(local_d0.p
                              [lVar16 + lVar12 + (iVar10 - local_d0.begin.z) * local_d0.kstride]))))
                ))) {
              lVar16 = (iVar10 - local_110.begin.z) * local_110.kstride;
              uVar31 = (-(uint)(local_110.p[lVar27 + (iVar1 - local_110.begin.x) + lVar16] != 0.0) &
                       1) << 0x19 | uVar32;
              uVar32 = uVar31 | 0x10000000;
              if ((local_110.p[lVar13 + (iVar1 - local_110.begin.x) + lVar16] != 0.0) ||
                 (NAN(local_110.p[lVar13 + (iVar1 - local_110.begin.x) + lVar16]))) {
                uVar32 = uVar31 | 0x90000000;
              }
            }
            if ((((dVar4 != 0.0) || (NAN(dVar4))) &&
                ((local_150.p[(int)(iVar9 + uVar15) * local_150.jstride + lVar17 + lVar20] != 0.0 ||
                 (NAN(local_150.p[(int)(iVar9 + uVar15) * local_150.jstride + lVar17 + lVar20])))))
               || (((dVar6 != 0.0 || (NAN(dVar6))) &&
                   ((local_110.p[lVar27 + lVar25 + (int)(iVar8 + uVar18) * local_110.kstride] != 0.0
                    || (NAN(local_110.p[lVar27 + lVar25 + (int)(iVar8 + uVar18) * local_110.kstride]
                           ))))))) {
              lVar16 = (int)(uVar14 + iVar9) * local_d0.jstride;
              lVar22 = (int)(iVar8 + uVar21) * local_d0.kstride;
              uVar31 = (-(uint)(local_d0.p[lVar16 + lVar24 + lVar22] != 0.0) & 1) << 5 | uVar32;
              uVar32 = uVar31 | 0x40;
              if ((local_d0.p[lVar16 + lVar12 + lVar22] != 0.0) ||
                 (NAN(local_d0.p[lVar16 + lVar12 + lVar22]))) {
                uVar32 = uVar31 | 0xc0;
              }
            }
            if ((((dVar5 != 0.0) || (NAN(dVar5))) &&
                ((local_150.p[(iVar11 - local_150.begin.y) * local_150.jstride + lVar17 + lVar20] !=
                  0.0 || (NAN(local_150.p
                              [(iVar11 - local_150.begin.y) * local_150.jstride + lVar17 + lVar20]))
                 ))) || (((dVar6 != 0.0 || (NAN(dVar6))) &&
                         ((local_110.p[lVar13 + lVar25 + (int)(uVar18 + iVar8) * local_110.kstride]
                           != 0.0 ||
                          (NAN(local_110.p
                               [lVar13 + lVar25 + (int)(uVar18 + iVar8) * local_110.kstride])))))))
            {
              lVar16 = (iVar11 - local_d0.begin.y) * local_d0.jstride;
              lVar20 = (int)(uVar21 + iVar8) * local_d0.kstride;
              uVar31 = (-(uint)(local_d0.p[lVar16 + lVar24 + lVar20] != 0.0) & 1) << 0xb | uVar32;
              uVar32 = uVar31 | 0x1000;
              if ((local_d0.p[lVar16 + lVar12 + lVar20] != 0.0) ||
                 (NAN(local_d0.p[lVar16 + lVar12 + lVar20]))) {
                uVar32 = uVar31 | 0x3000;
              }
            }
            if ((((dVar4 != 0.0) || (NAN(dVar4))) &&
                ((local_150.p[(int)(uVar15 + iVar9) * local_150.jstride + lVar17 + lVar29] != 0.0 ||
                 (NAN(local_150.p[(int)(uVar15 + iVar9) * local_150.jstride + lVar17 + lVar29])))))
               || (((dVar7 != 0.0 || (NAN(dVar7))) &&
                   ((local_110.p[lVar27 + lVar25 + (iVar10 - local_110.begin.z) * local_110.kstride]
                     != 0.0 ||
                    (NAN(local_110.p
                         [lVar27 + lVar25 + (iVar10 - local_110.begin.z) * local_110.kstride])))))))
            {
              lVar16 = (int)(uVar14 + iVar9) * local_d0.jstride;
              lVar20 = (iVar10 - local_d0.begin.z) * local_d0.kstride;
              uVar14 = (-(uint)(local_d0.p[lVar16 + lVar24 + lVar20] != 0.0) & 1) << 0x17 | uVar32;
              uVar32 = uVar14 | 0x1000000;
              if ((local_d0.p[lVar16 + lVar12 + lVar20] != 0.0) ||
                 (NAN(local_d0.p[lVar16 + lVar12 + lVar20]))) {
                uVar32 = uVar14 | 0x3000000;
              }
            }
            if ((((dVar5 != 0.0) || (NAN(dVar5))) &&
                ((local_150.p[(iVar11 - local_150.begin.y) * local_150.jstride + lVar17 + lVar29] !=
                  0.0 || (NAN(local_150.p
                              [(iVar11 - local_150.begin.y) * local_150.jstride + lVar17 + lVar29]))
                 ))) || (((dVar7 != 0.0 || (NAN(dVar7))) &&
                         ((local_110.p
                           [lVar13 + lVar25 + (iVar10 - local_110.begin.z) * local_110.kstride] !=
                           0.0 || (NAN(local_110.p
                                       [lVar13 + lVar25 + (iVar10 - local_110.begin.z) *
                                                          local_110.kstride]))))))) {
              lVar13 = (iVar11 - local_d0.begin.y) * local_d0.jstride;
              lVar16 = (iVar10 - local_d0.begin.z) * local_d0.kstride;
              uVar14 = (-(uint)(local_d0.p[lVar13 + lVar24 + lVar16] != 0.0) & 1) << 0x1d | uVar32;
              uVar32 = uVar14 | 0x40000000;
              if ((local_d0.p[lVar13 + lVar12 + lVar16] != 0.0) ||
                 (NAN(local_d0.p[lVar13 + lVar12 + lVar16]))) {
                uVar32 = uVar14 | 0xc0000000;
              }
            }
          }
          local_190.p[lVar19 + ((long)iVar35 - (long)local_190.begin.x) + lVar34].flag = uVar32;
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Level::buildCellFlag ()
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].FillBoundary(0,1,{AMREX_D_DECL(1,1,1)},m_geom.periodicity());
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_cellflag,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cflag = m_cellflag.array(mfi);
        AMREX_D_TERM(auto const& apx = m_areafrac[0].const_array(mfi);,
                     auto const& apy = m_areafrac[1].const_array(mfi);,
                     auto const& apz = m_areafrac[2].const_array(mfi););
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            amrex::ignore_unused(k);
            build_cellflag_from_ap(AMREX_D_DECL(i,j,k),
                                   cflag, AMREX_D_DECL(apx,apy,apz));
        });
    }
}